

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O0

void __thiscall
spatial_region::fout_irho_yzplane
          (spatial_region *this,int ion_type,ofstream *pfout,int i,openmode mode)

{
  bool bVar1;
  double ***pppdVar2;
  ostream *poVar3;
  undefined4 in_ECX;
  field3d<double> *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  int k;
  int j;
  int in_stack_ffffffffffffffbc;
  field3d<double> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd8;
  int iVar4;
  int in_stack_ffffffffffffffdc;
  int iVar5;
  field3d<double> *pfVar6;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = is_mode_non_binary((openmode)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  if (bVar1) {
    for (iVar5 = 0; iVar5 < *(int *)(in_RDI + 4); iVar5 = iVar5 + 1) {
      for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 8); iVar4 = iVar4 + 1) {
        pfVar6 = in_RDX;
        std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::operator[]
                  ((vector<field3d<double>,_std::allocator<field3d<double>_>_> *)(in_RDI + 0x230),
                   (long)in_ESI);
        pppdVar2 = field3d<double>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)in_RDX,(*pppdVar2)[iVar5][iVar4]);
        std::operator<<(poVar3,"\n");
        in_RDX = pfVar6;
      }
    }
  }
  else {
    bVar1 = is_mode_binary((openmode)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (bVar1) {
      std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::operator[]
                ((vector<field3d<double>,_std::allocator<field3d<double>_>_> *)(in_RDI + 0x230),
                 (long)in_ESI);
      write_binary_yzplane<double>
                ((ofstream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                 (_func_double_field3d<double>_ptr_int_int_int *)CONCAT44(in_ECX,in_R8D),
                 in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20));
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"fout_irho_yzplane: ERROR: wrong mode");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void spatial_region::fout_irho_yzplane(int ion_type, ofstream* pfout, int i,
        ios_base::openmode mode)
{
    if (is_mode_non_binary(mode)) {
        for(int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++) {
                (*pfout)<<irho[ion_type][i][j][k]<<"\n";
            }
        }
    } else if (is_mode_binary(mode)) {
        write_binary_yzplane<double>(pfout, irho[ion_type], getdouble, i, ny,
                nz);
    } else {
        cerr << "fout_irho_yzplane: ERROR: wrong mode" << endl;
    }
}